

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void RenderArrowsForVerticalBar(ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w)

{
  ImDrawList *pIVar1;
  float _y;
  float fVar2;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImDrawList *local_48;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  float local_24;
  ImDrawList *pIStack_20;
  float bar_w_local;
  ImDrawList *draw_list_local;
  ImVec2 half_sz_local;
  ImVec2 pos_local;
  
  draw_list_local._0_4_ = half_sz.x;
  half_sz_local.x = pos.x;
  half_sz_local.y = pos.y;
  fVar2 = half_sz_local.x + draw_list_local._0_4_;
  local_24 = bar_w;
  pIStack_20 = draw_list;
  draw_list_local = (ImDrawList *)half_sz;
  _y = half_sz_local.y;
  half_sz_local = pos;
  ImVec2::ImVec2(&local_2c,fVar2 + 1.0,_y);
  ImVec2::ImVec2(&local_34,draw_list_local._0_4_ + 2.0,draw_list_local._4_4_ + 1.0);
  RenderArrow(draw_list,local_2c,local_34,1,0xff000000);
  pIVar1 = pIStack_20;
  ImVec2::ImVec2(&local_3c,half_sz_local.x + draw_list_local._0_4_,half_sz_local.y);
  local_48 = draw_list_local;
  RenderArrow(pIVar1,local_3c,(ImVec2)draw_list_local,1,0xffffffff);
  pIVar1 = pIStack_20;
  ImVec2::ImVec2(&local_50,((half_sz_local.x + local_24) - draw_list_local._0_4_) - 1.0,
                 half_sz_local.y);
  ImVec2::ImVec2(&local_58,draw_list_local._0_4_ + 2.0,draw_list_local._4_4_ + 1.0);
  RenderArrow(pIVar1,local_50,local_58,0,0xff000000);
  pIVar1 = pIStack_20;
  ImVec2::ImVec2(&local_60,(half_sz_local.x + local_24) - draw_list_local._0_4_,half_sz_local.y);
  RenderArrow(pIVar1,local_60,(ImVec2)draw_list_local,0,0xffffffff);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w)
{
    RenderArrow(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32_BLACK);
    RenderArrow(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32_WHITE);
    RenderArrow(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32_BLACK);
    RenderArrow(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32_WHITE);
}